

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::get_hybrid_action_cost(search *sch,size_t idx,uint64_t n)

{
  uint uVar1;
  bool bVar2;
  task_data *ptVar3;
  v_array<unsigned_int> *this;
  v_array<unsigned_int> *this_00;
  v_array<unsigned_int> *this_01;
  size_t sVar4;
  ulong i_00;
  uint *puVar5;
  ulong in_RDX;
  ulong in_RSI;
  search *in_RDI;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t last;
  size_t size;
  v_array<unsigned_int> *gold_heads;
  v_array<unsigned_int> *stack;
  v_array<unsigned_int> *action_loss;
  task_data *data;
  uint local_6c;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  
  ptVar3 = Search::search::get_task_data<task_data>(in_RDI);
  this = &ptVar3->action_loss;
  this_00 = &ptVar3->stack;
  this_01 = &ptVar3->gold_heads;
  sVar4 = v_array<unsigned_int>::size(this_00);
  if (sVar4 == 0) {
    local_6c = 0;
  }
  else {
    local_6c = v_array<unsigned_int>::last(this_00);
  }
  i_00 = (ulong)local_6c;
  for (local_50 = 1; local_50 < 4; local_50 = local_50 + 1) {
    puVar5 = v_array<unsigned_int>::operator[](this,local_50);
    *puVar5 = 0;
  }
  bVar2 = v_array<unsigned_int>::empty(this_00);
  if (!bVar2) {
    for (local_58 = 0; local_58 < sVar4 - 1; local_58 = local_58 + 1) {
      if (in_RSI <= in_RDX) {
        puVar5 = v_array<unsigned_int>::operator[](this_00,local_58);
        puVar5 = v_array<unsigned_int>::operator[](this_01,(ulong)*puVar5);
        if (*puVar5 != in_RSI) {
          puVar5 = v_array<unsigned_int>::operator[](this_01,in_RSI);
          uVar1 = *puVar5;
          puVar5 = v_array<unsigned_int>::operator[](this_00,local_58);
          if (uVar1 != *puVar5) goto LAB_003e366a;
        }
        puVar5 = v_array<unsigned_int>::operator[](this,1);
        *puVar5 = *puVar5 + 1;
      }
LAB_003e366a:
    }
  }
  if ((sVar4 != 0) && (puVar5 = v_array<unsigned_int>::operator[](this_01,i_00), *puVar5 == in_RSI))
  {
    puVar5 = v_array<unsigned_int>::operator[](this,1);
    *puVar5 = *puVar5 + 1;
  }
  for (local_60 = in_RSI + 1; local_60 <= in_RDX; local_60 = local_60 + 1) {
    puVar5 = v_array<unsigned_int>::operator[](this_01,local_60);
    if ((*puVar5 == i_00) ||
       (puVar5 = v_array<unsigned_int>::operator[](this_01,i_00), *puVar5 == local_60)) {
      puVar5 = v_array<unsigned_int>::operator[](this,3);
      *puVar5 = *puVar5 + 1;
    }
  }
  if (((sVar4 != 0) && (in_RSI <= in_RDX)) &&
     (puVar5 = v_array<unsigned_int>::operator[](this_01,in_RSI), *puVar5 == i_00)) {
    puVar5 = v_array<unsigned_int>::operator[](this,3);
    *puVar5 = *puVar5 + 1;
  }
  if (1 < sVar4) {
    puVar5 = v_array<unsigned_int>::operator[](this_01,i_00);
    uVar1 = *puVar5;
    puVar5 = v_array<unsigned_int>::operator[](this_00,sVar4 - 2);
    if (uVar1 == *puVar5) {
      puVar5 = v_array<unsigned_int>::operator[](this,3);
      *puVar5 = *puVar5 + 1;
    }
  }
  puVar5 = v_array<unsigned_int>::operator[](this_01,i_00);
  local_68 = in_RSI;
  if (in_RSI <= *puVar5) {
    puVar5 = v_array<unsigned_int>::operator[](this,2);
    *puVar5 = *puVar5 + 1;
  }
  for (; local_68 <= in_RDX; local_68 = local_68 + 1) {
    puVar5 = v_array<unsigned_int>::operator[](this_01,local_68);
    if (*puVar5 == local_6c) {
      puVar5 = v_array<unsigned_int>::operator[](this,2);
      *puVar5 = *puVar5 + 1;
    }
  }
  return;
}

Assistant:

void get_hybrid_action_cost(Search::search &sch, size_t idx, uint64_t n)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &action_loss = data->action_loss, &stack = data->stack, &gold_heads = data->gold_heads;
  size_t size = stack.size();
  size_t last = (size == 0) ? 0 : stack.last();

  for (size_t i = 1; i <= 3; i++) action_loss[i] = 0;
  if (!stack.empty())
    for (size_t i = 0; i < size - 1; i++)
      if (idx <= n && (gold_heads[stack[i]] == idx || gold_heads[idx] == stack[i]))
        action_loss[SHIFT] += 1;

  if (size > 0 && gold_heads[last] == idx)
    action_loss[SHIFT] += 1;

  for (size_t i = idx + 1; i <= n; i++)
    if (gold_heads[i] == last || gold_heads[last] == i)
      action_loss[REDUCE_LEFT] += 1;
  if (size > 0 && idx <= n && gold_heads[idx] == last)
    action_loss[REDUCE_LEFT] += 1;
  if (size >= 2 && gold_heads[last] == stack[size - 2])
    action_loss[REDUCE_LEFT] += 1;

  if (gold_heads[last] >= idx)
    action_loss[REDUCE_RIGHT] += 1;

  for (size_t i = idx; i <= n; i++)
    if (gold_heads[i] == (uint32_t)last)
      action_loss[REDUCE_RIGHT] += 1;
}